

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_pool_2d(ggml_compute_params *params,ggml_tensor *dst)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ggml_tensor *pgVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  void *pvVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  void *pvVar23;
  float *pfVar24;
  float *pfVar25;
  undefined4 uVar26;
  float fVar27;
  void *local_a0;
  
  if (params->ith == 0) {
    uVar1 = dst->op_params[2];
    pgVar8 = dst->src[0];
    iVar2 = dst->op_params[0];
    uVar3 = dst->op_params[1];
    iVar4 = dst->op_params[4];
    iVar5 = dst->op_params[3];
    pvVar23 = pgVar8->data;
    iVar6 = dst->op_params[6];
    iVar7 = dst->op_params[5];
    lVar13 = ggml_nbytes(pgVar8);
    uVar9 = dst->ne[1];
    uVar10 = dst->ne[0];
    local_a0 = dst->data;
    pvVar14 = (void *)(lVar13 + (long)pvVar23);
    for (; pvVar23 < pvVar14; pvVar23 = (void *)((long)pvVar23 + pgVar8->nb[2])) {
      iVar12 = -iVar6;
      for (uVar17 = 0; uVar17 != (~((long)uVar9 >> 0x3f) & uVar9); uVar17 = uVar17 + 1) {
        lVar13 = uVar10 * uVar17;
        iVar11 = -iVar7;
        for (uVar21 = 0; uVar21 != (~((long)uVar10 >> 0x3f) & uVar10); uVar21 = uVar21 + 1) {
          if (iVar2 == 0) {
            uVar26 = 0xff7fffff;
LAB_0013f053:
            *(undefined4 *)((long)local_a0 + uVar21 * 4 + lVar13 * 4) = uVar26;
          }
          else {
            uVar26 = 0;
            if (iVar2 == 1) goto LAB_0013f053;
            if (iVar2 == 2) {
              uVar18 = 0x18cf;
              goto LAB_0013f19e;
            }
          }
          lVar20 = (long)iVar11;
          lVar22 = (long)iVar12;
          for (uVar19 = 0; uVar19 != (~((int)uVar1 >> 0x1f) & uVar1); uVar19 = uVar19 + 1) {
            lVar15 = uVar19 + (long)(iVar4 * (int)uVar17 - iVar6);
            if ((-1 < lVar15) && (lVar15 < pgVar8->ne[1])) {
              lVar15 = pgVar8->nb[1] * lVar22;
              pfVar25 = (float *)((long)pvVar23 + lVar15 + lVar20 * 4);
              for (uVar16 = 0; (~((int)uVar3 >> 0x1f) & uVar3) != uVar16; uVar16 = uVar16 + 1) {
                if ((-1 < (long)(lVar20 + uVar16)) && ((long)(lVar20 + uVar16) < pgVar8->ne[0])) {
                  pfVar24 = pfVar25;
                  if (pgVar8->type != GGML_TYPE_F32) {
                    pfVar24 = (float *)(&ggml_table_f32_f16 +
                                       (ulong)*(ushort *)
                                               ((long)pvVar23 + uVar16 * 2 + lVar15 + lVar20 * 2) *
                                       4);
                  }
                  fVar27 = *pfVar24;
                  if (iVar2 == 0) {
                    if (*(float *)((long)local_a0 + uVar21 * 4 + lVar13 * 4) < fVar27)
                    goto LAB_0013f102;
                  }
                  else if (iVar2 == 1) {
                    fVar27 = fVar27 + *(float *)((long)local_a0 + uVar21 * 4 + lVar13 * 4);
LAB_0013f102:
                    *(float *)((long)local_a0 + uVar21 * 4 + lVar13 * 4) = fVar27;
                  }
                  else if (iVar2 == 2) {
                    uVar18 = 0x18df;
                    goto LAB_0013f19e;
                  }
                }
                pfVar25 = pfVar25 + 1;
              }
            }
            lVar22 = lVar22 + 1;
          }
          if (iVar2 == 1) {
            *(float *)((long)local_a0 + uVar21 * 4 + lVar13 * 4) =
                 *(float *)((long)local_a0 + uVar21 * 4 + lVar13 * 4) / (float)(int)(uVar1 * uVar3);
          }
          else if (iVar2 == 2) {
            uVar18 = 0x18e6;
LAB_0013f19e:
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
                       ,uVar18,"fatal error");
          }
          iVar11 = iVar11 + iVar5;
        }
        iVar12 = iVar12 + iVar4;
      }
      local_a0 = (void *)((long)local_a0 + uVar9 * uVar10 * 4);
    }
  }
  return;
}

Assistant:

void ggml_compute_forward_pool_2d(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src = dst->src[0];

    assert(src->type == GGML_TYPE_F32 || src->type == GGML_TYPE_F16);

    if (params->ith != 0) {
        return;
    }

    const int32_t * opts = (const int32_t *)dst->op_params;
    ggml_op_pool op = static_cast<ggml_op_pool>(opts[0]);
    const int k0 = opts[1];
    const int k1 = opts[2];
    const int s0 = opts[3];
    const int s1 = opts[4];
    const int p0 = opts[5];
    const int p1 = opts[6];
    const char * cdata = (const char*)src->data;
    const char * const data_end = cdata + ggml_nbytes(src);

    const int64_t px = dst->ne[0];
    const int64_t py = dst->ne[1];
    const int64_t pa = px * py;

    float * dplane = (float *)dst->data;

    const int ka = k0 * k1;
    const int offset0 = -p0;
    const int offset1 = -p1;

    while (cdata < data_end) {
        for (int oy = 0; oy < py; ++oy) {
            float * const drow = dplane + oy * px;
            for (int ox = 0; ox < px; ++ox) {
                float * const out =  drow + ox;
                switch (op) {
                    case GGML_OP_POOL_AVG:     *out = 0;        break;
                    case GGML_OP_POOL_MAX:     *out = -FLT_MAX; break;
                    case GGML_OP_POOL_COUNT: GGML_ABORT("fatal error");
                }

                const int ix = offset0 + ox * s0;
                const int iy = offset1 + oy * s1;

                for (int ky = 0; ky < k1; ++ky) {
                    if (iy + ky < 0 || iy + ky >= src->ne[1]) continue;
                    const void * srow = (const void *)(cdata + src->nb[1] * (iy + ky));
                    for (int kx = 0; kx < k0; ++kx) {
                        int j = ix + kx;
                        if (j < 0 || j >= src->ne[0]) continue;
                        const float srow_j = (src->type == GGML_TYPE_F32) ? ((const float*)srow)[j] : GGML_FP16_TO_FP32(((const ggml_fp16_t*)srow)[j]);
                        switch (op) {
                            case GGML_OP_POOL_AVG:                     *out += srow_j; break;
                            case GGML_OP_POOL_MAX: if (srow_j > *out)  *out  = srow_j; break;
                            case GGML_OP_POOL_COUNT:               GGML_ABORT("fatal error");
                        }
                    }
                }
                switch (op) {
                    case GGML_OP_POOL_AVG:           *out /= ka; break;
                    case GGML_OP_POOL_MAX:                       break;
                    case GGML_OP_POOL_COUNT: GGML_ABORT("fatal error");
                }
            }
        }

        cdata  += src->nb[2];
        dplane += pa;
    }
}